

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O1

void http1_websocket_client_on_upgrade(http_s *h,char *proto,size_t len)

{
  uintptr_t uVar1;
  websocket_settings_s *args;
  intptr_t uuid;
  http_settings_s *http_settings;
  
  uVar1 = (h->private_data).flag;
  args = (websocket_settings_s *)h->udata;
  uuid = *(intptr_t *)(uVar1 + 0x30);
  http_settings = *(http_settings_s **)(uVar1 + 0x38);
  http_settings->udata = (void *)0x0;
  http_finish(h);
  *(undefined1 *)(uVar1 + 0xfa) = 1;
  websocket_attach(uuid,http_settings,args,*(void **)(uVar1 + 0x50),
                   (uVar1 - (long)*(void **)(uVar1 + 0x50)) + *(long *)(uVar1 + 0xe0) + 0xfb);
  fio_free(args);
  return;
}

Assistant:

static void http1_websocket_client_on_upgrade(http_s *h, char *proto,
                                              size_t len) {
  http1pr_s *p = handle2pr(h);
  websocket_settings_s *args = h->udata;
  const intptr_t uuid = handle2pr(h)->p.uuid;
  http_settings_s *set = handle2pr(h)->p.settings;
  set->udata = NULL;
  http_finish(h);
  p->stop = 1;
  websocket_attach(uuid, set, args, p->parser.state.next,
                   p->buf_len - (intptr_t)(p->parser.state.next - p->buf));
  fio_free(args);
  (void)proto;
  (void)len;
}